

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.h
# Opt level: O2

long __thiscall
MathML::AST::ConstantExpression::unaryOperation<long>
          (ConstantExpression *this,long *operand,Operator op)

{
  ErrorHandler *pEVar1;
  ostream *poVar2;
  String *pSVar3;
  ulong uVar4;
  Error error;
  ostringstream oss;
  String SStack_1e8;
  Error local_1c8;
  ostringstream local_198 [376];
  
  if (op == NOT) {
    uVar4 = (ulong)(*operand == 0);
  }
  else if (op == SUB) {
    uVar4 = -*operand;
  }
  else {
    if (op != ADD) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar2 = std::operator<<((ostream *)local_198,"invalid operator: ");
      pSVar3 = UnaryExpression::operatorString_abi_cxx11_(op);
      poVar2 = std::operator<<(poVar2,(string *)pSVar3);
      std::operator<<(poVar2,", cause operand not of type \'bool\' [f, t]");
      pEVar1 = this->mErrorHandler;
      if (pEVar1 != (ErrorHandler *)0x0) {
        std::__cxx11::stringbuf::str();
        Error::Error(&local_1c8,ERR_INVALIDPARAMS,&SStack_1e8);
        std::__cxx11::string::~string((string *)&SStack_1e8);
        (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_1c8);
        this = (ConstantExpression *)*operand;
        Error::~Error(&local_1c8);
      }
      std::__cxx11::ostringstream::~ostringstream(local_198);
      if (pEVar1 != (ErrorHandler *)0x0) {
        return (long)this;
      }
    }
    uVar4 = *operand;
  }
  return uVar4;
}

Assistant:

T ConstantExpression::unaryOperation( const T& operand, UnaryExpression::Operator op ) const
        {
            switch ( op )
            {

            case AST::UnaryExpression::ADD:
                //do nothing
                return operand;

            case AST::UnaryExpression::SUB:
                return ( -operand );

            case AST::UnaryExpression::NOT:
                return ( !operand );

            default:
                std::ostringstream oss;
                oss << "invalid operator: " << AST::UnaryExpression::operatorString( op ) << ", cause operand not of type 'bool' [f, t]";
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, oss.str() );
                    mErrorHandler->handleError( &error );
                    return operand;
                }
            }
            return operand;
        }